

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptStructDeclarationList
          (HlslGrammar *this,TTypeList **typeList,TIntermNode **nodeList,
          TVector<glslang::TFunctionDeclarator> *declarators)

{
  bool bVar1;
  int iVar2;
  TVector<glslang::TTypeLoc> *this_00;
  size_type sVar3;
  reference declarator;
  TType *this_01;
  reference pvVar4;
  undefined4 extraout_var;
  size_t s;
  TIntermTyped *local_150;
  TIntermTyped *expressionNode;
  TArraySizes *arraySizes;
  TTypeLoc member;
  undefined1 local_118 [3];
  bool functionDefinitionAccepted;
  TType memberType;
  undefined1 local_78 [7];
  bool declarator_list;
  TAttributes attributes;
  HlslToken idToken;
  TVector<glslang::TFunctionDeclarator> *declarators_local;
  TIntermNode **nodeList_local;
  TTypeList **typeList_local;
  HlslGrammar *this_local;
  
  this_00 = (TVector<glslang::TTypeLoc> *)
            TVector<glslang::TTypeLoc>::operator_new
                      ((TVector<glslang::TTypeLoc> *)0x20,(size_t)typeList);
  TVector<glslang::TTypeLoc>::TVector(this_00);
  *typeList = this_00;
  HlslToken::HlslToken
            ((HlslToken *)
             &attributes.
              super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
              .
              super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
              ._M_impl._M_node._M_size);
  do {
    bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokRightBrace);
    if (bVar1) {
      this_local._7_1_ = 1;
      break;
    }
    TList<glslang::TAttributeArgs>::TList((TList<glslang::TAttributeArgs> *)local_78);
    acceptAttributes(this,(TAttributes *)local_78);
    memberType.spirvType._7_1_ = 0;
    TType::TType((TType *)local_118,EbtVoid,EvqTemporary,1,0,0,false);
    bVar1 = acceptFullySpecifiedType(this,(TType *)local_118,nodeList,(TAttributes *)local_78,false)
    ;
    if (bVar1) {
      HlslParseContext::transferTypeAttributes
                (this->parseContext,&(this->super_HlslTokenStream).token.loc,(TAttributes *)local_78
                 ,(TType *)local_118,false);
      member.loc.column._3_1_ = 0;
      while (bVar1 = acceptIdentifier(this,(HlslToken *)
                                           &attributes.
                                            super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                                            .
                                            super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                                            ._M_impl._M_node._M_size), bVar1) {
        s = 0x163;
        bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
        if (bVar1) {
          if ((memberType.spirvType._7_1_ & 1) == 0) {
            sVar3 = std::
                    vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                    ::size(&declarators->
                            super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                          );
            std::
            vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
            ::resize(&declarators->
                      super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                     ,sVar3 + 1);
            declarator = std::
                         vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                         ::back(&declarators->
                                 super_vector<glslang::TFunctionDeclarator,_glslang::pool_allocator<glslang::TFunctionDeclarator>_>
                               );
            member.loc.column._3_1_ =
                 acceptMemberFunctionDefinition
                           (this,nodeList,(TType *)local_118,(TString *)idToken._24_8_,declarator);
            if ((bool)member.loc.column._3_1_) goto LAB_005abaa7;
          }
          expected(this,"member-function definition");
          this_local._7_1_ = 0;
          member.loc._20_4_ = 1;
          goto LAB_005abaf2;
        }
        this_01 = (TType *)TType::operator_new((TType *)0x98,s);
        TType::TType(this_01,EbtVoid,EvqTemporary,1,0,0,false);
        member.type = (TType *)(this->super_HlslTokenStream).token.loc.name;
        member.loc.name = *(TString **)&(this->super_HlslTokenStream).token.loc.string;
        member.loc.string = (this->super_HlslTokenStream).token.loc.column;
        member.loc.line = *(int *)&(this->super_HlslTokenStream).token.loc.field_0x14;
        arraySizes = (TArraySizes *)this_01;
        TType::shallowCopy(this_01,(TType *)local_118);
        (*(arraySizes->sizes)._vptr_TSmallArrayVector[4])(arraySizes,idToken._24_8_);
        std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::push_back
                  (&(*typeList)->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>,
                   (value_type *)&arraySizes);
        expressionNode = (TIntermTyped *)0x0;
        acceptArraySpecifier(this,(TArraySizes **)&expressionNode);
        if (expressionNode != (TIntermTyped *)0x0) {
          pvVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::back
                             (&(*typeList)->
                               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             );
          TType::transferArraySizes(pvVar4->type,(TArraySizes *)expressionNode);
        }
        iVar2 = (*(arraySizes->sizes)._vptr_TSmallArrayVector[10])();
        acceptPostDecls(this,(TQualifier *)CONCAT44(extraout_var,iVar2));
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokAssign);
        if (bVar1) {
          (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
            [0x2e])(this->parseContext,
                    &attributes.
                     super_list<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                     .
                     super__List_base<glslang::TAttributeArgs,_glslang::pool_allocator<glslang::TAttributeArgs>_>
                     ._M_impl._M_node._M_size,"struct-member initializers ignored","typedef","");
          local_150 = (TIntermTyped *)0x0;
          bVar1 = acceptAssignmentExpression(this,&local_150);
          if (!bVar1) {
            expected(this,"initializer");
            this_local._7_1_ = 0;
            member.loc._20_4_ = 1;
            goto LAB_005abaf2;
          }
        }
        bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokSemicolon);
        if (bVar1) {
LAB_005abaa7:
          if (((member.loc.column._3_1_ & 1) != 0) ||
             (bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokSemicolon)
             , bVar1)) {
            member.loc._20_4_ = 0;
          }
          else {
            expected(this,";");
            this_local._7_1_ = 0;
            member.loc._20_4_ = 1;
          }
          goto LAB_005abaf2;
        }
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
        if (!bVar1) {
          expected(this,",");
          this_local._7_1_ = 0;
          member.loc._20_4_ = 1;
          goto LAB_005abaf2;
        }
        memberType.spirvType._7_1_ = 1;
      }
      expected(this,"member name");
      this_local._7_1_ = 0;
      member.loc._20_4_ = 1;
    }
    else {
      expected(this,"member type");
      this_local._7_1_ = 0;
      member.loc._20_4_ = 1;
    }
LAB_005abaf2:
    TType::~TType((TType *)local_118);
    TList<glslang::TAttributeArgs>::~TList((TList<glslang::TAttributeArgs> *)local_78);
  } while (member.loc._20_4_ == 0);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool HlslGrammar::acceptStructDeclarationList(TTypeList*& typeList, TIntermNode*& nodeList,
                                              TVector<TFunctionDeclarator>& declarators)
{
    typeList = new TTypeList();
    HlslToken idToken;

    do {
        // success on seeing the RIGHT_BRACE coming up
        if (peekTokenClass(EHTokRightBrace))
            break;

        // struct_declaration

        // attributes
        TAttributes attributes;
        acceptAttributes(attributes);

        bool declarator_list = false;

        // fully_specified_type
        TType memberType;
        if (! acceptFullySpecifiedType(memberType, nodeList, attributes)) {
            expected("member type");
            return false;
        }
        
        // merge in the attributes
        parseContext.transferTypeAttributes(token.loc, attributes, memberType);

        // struct_declarator COMMA struct_declarator ...
        bool functionDefinitionAccepted = false;
        do {
            if (! acceptIdentifier(idToken)) {
                expected("member name");
                return false;
            }

            if (peekTokenClass(EHTokLeftParen)) {
                // function_parameters
                if (!declarator_list) {
                    declarators.resize(declarators.size() + 1);
                    // request a token stream for deferred processing
                    functionDefinitionAccepted = acceptMemberFunctionDefinition(nodeList, memberType, *idToken.string,
                                                                                declarators.back());
                    if (functionDefinitionAccepted)
                        break;
                }
                expected("member-function definition");
                return false;
            } else {
                // add it to the list of members
                TTypeLoc member = { new TType(EbtVoid), token.loc };
                member.type->shallowCopy(memberType);
                member.type->setFieldName(*idToken.string);
                typeList->push_back(member);

                // array_specifier
                TArraySizes* arraySizes = nullptr;
                acceptArraySpecifier(arraySizes);
                if (arraySizes)
                    typeList->back().type->transferArraySizes(arraySizes);

                acceptPostDecls(member.type->getQualifier());

                // EQUAL assignment_expression
                if (acceptTokenClass(EHTokAssign)) {
                    parseContext.warn(idToken.loc, "struct-member initializers ignored", "typedef", "");
                    TIntermTyped* expressionNode = nullptr;
                    if (! acceptAssignmentExpression(expressionNode)) {
                        expected("initializer");
                        return false;
                    }
                }
            }
            // success on seeing the SEMICOLON coming up
            if (peekTokenClass(EHTokSemicolon))
                break;

            // COMMA
            if (acceptTokenClass(EHTokComma))
                declarator_list = true;
            else {
                expected(",");
                return false;
            }

        } while (true);

        // SEMI_COLON
        if (! functionDefinitionAccepted && ! acceptTokenClass(EHTokSemicolon)) {
            expected(";");
            return false;
        }

    } while (true);

    return true;
}